

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_operation.c
# Opt level: O0

int async_operation_cancel(ASYNC_OPERATION_HANDLE async_operation)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  ASYNC_OPERATION_HANDLE async_operation_local;
  
  if (async_operation == (ASYNC_OPERATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/async_operation.c"
                ,"async_operation_cancel",0x49,1,"NULL async_operation");
    }
    l._4_4_ = 0x4a;
  }
  else {
    (*async_operation->async_operation_cancel_handler)(async_operation);
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int async_operation_cancel(ASYNC_OPERATION_HANDLE async_operation)
{
    int result;

    if (async_operation == NULL)
    {
        LogError("NULL async_operation");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_ASYNC_OPERATION_01_007: [ `async_operation_cancel` shall cancel the operation by calling the cancel handler function passed to `async_operation_create`.]*/
        async_operation->async_operation_cancel_handler(async_operation);

        /* Codes_SRS_ASYNC_OPERATION_01_008: [ On success `async_operation_cancel` shall return 0.]*/
        result = 0;
    }

    return result;
}